

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2.c
# Opt level: O0

void proof_chain_resolve(sat_solver2 *s,clause *cls,int Var)

{
  Int2_Man_t *p;
  int varA;
  int iVar1;
  clause *local_70;
  clause *local_68;
  clause *local_48;
  int ProofId;
  clause *c_2;
  clause *c_1;
  clause *c;
  int Var_local;
  clause *cls_local;
  sat_solver2 *s_local;
  
  if (s->fProofLogging != 0) {
    if (s->pInt2 != (Int2_Man_t *)0x0) {
      local_48 = cls;
      if (cls == (clause *)0x0) {
        local_48 = var_unit_clause(s,Var);
      }
      p = s->pInt2;
      iVar1 = s->tempInter;
      varA = var_is_partA(s,Var);
      iVar1 = Int2_ManChainResolve(p,local_48,iVar1,varA);
      s->tempInter = iVar1;
    }
    if (s->pPrf2 != (Prf_Man_t *)0x0) {
      local_68 = cls;
      if (cls == (clause *)0x0) {
        local_68 = var_unit_clause(s,Var);
      }
      Prf_ManChainResolve(s->pPrf2,local_68);
    }
    if (s->pPrf1 != (Vec_Set_t *)0x0) {
      local_70 = cls;
      if (cls == (clause *)0x0) {
        local_70 = var_unit_clause(s,Var);
      }
      iVar1 = var_is_partA(s,Var);
      iVar1 = clause2_proofid(s,local_70,iVar1);
      if (iVar1 >> 2 < 1) {
        __assert_fail("(ProofId >> 2) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver2.c"
                      ,0xcd,"void proof_chain_resolve(sat_solver2 *, clause *, int)");
      }
      veci_push(&s->temp_proof,iVar1);
    }
  }
  return;
}

Assistant:

static inline void proof_chain_resolve( sat_solver2* s, clause* cls, int Var )
{
    if ( !s->fProofLogging )
        return;
    if ( s->pInt2 )
    {
        clause* c = cls ? cls : var_unit_clause( s, Var );
        s->tempInter = Int2_ManChainResolve( s->pInt2, c, s->tempInter, var_is_partA(s,Var) );
    }
    if ( s->pPrf2 )
    {
        clause* c = cls ? cls : var_unit_clause( s, Var );
        Prf_ManChainResolve( s->pPrf2, c );
    }
    if ( s->pPrf1 )
    {
        clause* c = cls ? cls : var_unit_clause( s, Var );
        int ProofId = clause2_proofid(s, c, var_is_partA(s,Var));
        assert( (ProofId >> 2) > 0 );
        veci_push( &s->temp_proof, ProofId );
    }
}